

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  AdjacencyGrid *pAVar2;
  AdjacencyGridPoint *pAVar3;
  GLfloat *pGVar4;
  GLfloat *pGVar5;
  GLfloat *pGVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  pAVar2 = test_data->m_grid;
  uVar1 = (pAVar2->m_line_strip).m_n_points;
  test_data->m_n_vertices = uVar1;
  uVar12 = (uVar1 * 8 + -0x18) * this->m_n_components_output;
  test_data->m_geometry_bo_size = uVar12;
  uVar11 = this->m_n_components_input * uVar1 * 4;
  test_data->m_vertex_data_bo_size = uVar11;
  pGVar4 = (GLfloat *)operator_new__((ulong)uVar12);
  test_data->m_expected_adjacency_geometry = pGVar4;
  pGVar5 = (GLfloat *)operator_new__((ulong)uVar12);
  test_data->m_expected_geometry = pGVar5;
  pGVar6 = (GLfloat *)operator_new__((ulong)uVar11);
  test_data->m_vertex_data = pGVar6;
  for (lVar7 = 0; (ulong)uVar1 * 0xc - lVar7 != 0; lVar7 = lVar7 + 0xc) {
    pAVar3 = (pAVar2->m_line_strip).m_points;
    *pGVar6 = *(GLfloat *)((long)&pAVar3->x + lVar7);
    pGVar6[1] = *(GLfloat *)((long)&pAVar3->y + lVar7);
    pGVar6 = pGVar6 + 2;
  }
  uVar9 = 2;
  lVar7 = 0x14;
  lVar8 = 0;
  while (uVar9 - (uVar1 - 3) != 2) {
    pAVar3 = (pAVar2->m_line_strip).m_points;
    *(undefined4 *)((long)pGVar4 + lVar8) = *(undefined4 *)((long)pAVar3 + lVar7 + -0x10);
    *(undefined4 *)((long)pGVar4 + lVar8 + 4) = *(undefined4 *)((long)&pAVar3[-1].index + lVar7);
    *(undefined8 *)((long)pGVar4 + lVar8 + 8) = 0x3f80000000000000;
    uVar10 = uVar9 & 0xffffffff;
    uVar9 = uVar9 + 1;
    *(GLfloat *)((long)pGVar4 + lVar8 + 0x10) = pAVar3[uVar9 & 0xffffffff].x;
    *(GLfloat *)((long)pGVar4 + lVar8 + 0x14) = pAVar3[uVar9 & 0xffffffff].y;
    *(undefined8 *)((long)pGVar4 + lVar8 + 0x18) = 0x3f80000000000000;
    *(undefined4 *)((long)pGVar5 + lVar8) = *(undefined4 *)((long)pAVar3 + lVar7 + -4);
    *(undefined4 *)((long)pGVar5 + lVar8 + 4) = *(undefined4 *)((long)&pAVar3->index + lVar7);
    *(undefined8 *)((long)pGVar5 + lVar8 + 8) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar5 + lVar8 + 0x10) = pAVar3[uVar10].x;
    *(GLfloat *)((long)pGVar5 + lVar8 + 0x14) = pAVar3[uVar10].y;
    *(undefined8 *)((long)pGVar5 + lVar8 + 0x18) = 0x3f80000000000000;
    lVar7 = lVar7 + 0xc;
    lVar8 = lVar8 + 0x20;
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = 0;
	float* travellerExpectedGeometryPtr			 = 0;
	float* travellerPtr							 = 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices (apart from the three last ones) ) */
}